

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q1b_grandfather.cpp
# Opt level: O0

void solve(unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
           *d)

{
  long lVar1;
  const_iterator cVar2;
  bool bVar3;
  istream *this;
  pointer pvVar4;
  _Node_iterator_base<std::pair<const_long_long,_long_long>,_false> local_48;
  const_iterator ddb;
  const_iterator dda;
  const_iterator db;
  const_iterator da;
  longlong b;
  longlong a;
  const_iterator e;
  unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
  *d_local;
  
  e.super__Node_iterator_base<std::pair<const_long_long,_long_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_long_long,_long_long>,_false>)
       (_Node_iterator_base<std::pair<const_long_long,_long_long>,_false>)d;
  a = (longlong)
      std::
      unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
      ::end(d);
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&b);
  std::istream::operator>>(this,(longlong *)&da);
  if ((_Node_iterator_base<std::pair<const_long_long,_long_long>,_false>)b ==
      da.super__Node_iterator_base<std::pair<const_long_long,_long_long>,_false>._M_cur) {
    std::operator<<((ostream *)&std::cout,"NO\n");
  }
  else {
    db = std::
         unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
         ::find((unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
                 *)e.super__Node_iterator_base<std::pair<const_long_long,_long_long>,_false>._M_cur,
                &b);
    dda = std::
          unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
          ::find((unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
                  *)e.super__Node_iterator_base<std::pair<const_long_long,_long_long>,_false>._M_cur
                 ,(key_type *)&da);
    bVar3 = std::__detail::operator==
                      (&db.super__Node_iterator_base<std::pair<const_long_long,_long_long>,_false>,
                       (_Node_iterator_base<std::pair<const_long_long,_long_long>,_false> *)&a);
    if ((!bVar3) &&
       (bVar3 = std::__detail::operator==
                          (&dda.
                            super__Node_iterator_base<std::pair<const_long_long,_long_long>,_false>,
                           (_Node_iterator_base<std::pair<const_long_long,_long_long>,_false> *)&a),
       cVar2 = e, !bVar3)) {
      pvVar4 = std::__detail::
               _Node_const_iterator<std::pair<const_long_long,_long_long>,_false,_false>::operator->
                         (&db);
      ddb = std::
            unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
            ::find((unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
                    *)cVar2.super__Node_iterator_base<std::pair<const_long_long,_long_long>,_false>.
                      _M_cur,&pvVar4->second);
      cVar2 = e;
      pvVar4 = std::__detail::
               _Node_const_iterator<std::pair<const_long_long,_long_long>,_false,_false>::operator->
                         (&dda);
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<long_long,_long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_long_long>_>_>
           ::find(cVar2.super__Node_iterator_base<std::pair<const_long_long,_long_long>,_false>.
                  _M_cur,&pvVar4->second);
      bVar3 = std::__detail::operator==
                        (&ddb.
                          super__Node_iterator_base<std::pair<const_long_long,_long_long>,_false>,
                         (_Node_iterator_base<std::pair<const_long_long,_long_long>,_false> *)&a);
      if ((!bVar3) &&
         (bVar3 = std::__detail::operator==
                            (&local_48,
                             (_Node_iterator_base<std::pair<const_long_long,_long_long>,_false> *)&a
                            ), !bVar3)) {
        pvVar4 = std::__detail::
                 _Node_const_iterator<std::pair<const_long_long,_long_long>,_false,_false>::
                 operator->(&ddb);
        lVar1 = pvVar4->second;
        pvVar4 = std::__detail::
                 _Node_const_iterator<std::pair<const_long_long,_long_long>,_false,_false>::
                 operator->((_Node_const_iterator<std::pair<const_long_long,_long_long>,_false,_false>
                             *)&local_48);
        if (lVar1 == pvVar4->second) {
          std::operator<<((ostream *)&std::cout,"YES\n");
          return;
        }
        std::operator<<((ostream *)&std::cout,"NO\n");
        return;
      }
      std::operator<<((ostream *)&std::cout,"NO\n");
      return;
    }
    std::operator<<((ostream *)&std::cout,"NO\n");
  }
  return;
}

Assistant:

void solve(const unordered_map<long long, long long> &d) {
    auto e = d.end();

    long long a, b;
    cin >> a >> b;
    if (a == b) {
        cout << "NO\n";
        return;
    }
    auto da = d.find(a), db = d.find(b);
    if (da == e || db == e) {
        cout << "NO\n";
        return;
    }

    auto dda = d.find(da->second), ddb = d.find(db->second);
    if (dda == e || ddb == e) {
        cout << "NO\n";
        return;
    }

    if (dda->second == ddb->second) {
        cout << "YES\n";
        return;
    }
    cout << "NO\n";
}